

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_CommitAfterAppending4Mb_Test::TestBody(Transaction_CommitAfterAppending4Mb_Test *this)

{
  bool bVar1;
  shared_ptr<pstore::file::in_memory> *file;
  __shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  value_type vVar4;
  Message *pMVar5;
  char *pcVar6;
  AssertHelper local_370;
  Message local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_9;
  Message local_348;
  ContainerEqMatcher<std::array<unsigned_char,_8UL>_> local_340;
  StlContainer local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_8;
  Message local_318;
  typed_address<pstore::trailer> local_310;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_7;
  Message local_2f0;
  uint local_2e4;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_6;
  Message local_2c8;
  uint local_2bc;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_5;
  Message local_2a0;
  ContainerEqMatcher<std::array<unsigned_char,_8UL>_> local_298;
  StlContainer local_290;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_4;
  trailer *r0_footer;
  typed_address<pstore::trailer> r0_footer_offset;
  Message local_260;
  ContainerEqMatcher<std::array<unsigned_char,_8UL>_> local_258;
  StlContainer local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_3;
  Message local_230;
  uint local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_2;
  Message local_208;
  uint local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  Message local_1e0;
  ContainerEqMatcher<std::array<unsigned_char,_8UL>_> local_1d8;
  StlContainer local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar;
  trailer *r1_footer;
  typed_address<pstore::trailer> r1_footer_offset;
  header *header;
  size_t elements;
  unique_lock<mock_mutex> local_180;
  undefined1 local_170 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_130 [7];
  mock_mutex mutex;
  database db;
  Transaction_CommitAfterAppending4Mb_Test *this_local;
  
  file = in_memory_store::file(&(this->super_Transaction).store_);
  pstore::database::database<pstore::file::in_memory>((database *)local_130,file,true);
  pstore::database::set_vacuum_mode((database *)local_130,disabled);
  std::unique_lock<mock_mutex>::unique_lock(&local_180,(mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_170,(database *)local_130,&local_180);
  std::unique_lock<mock_mutex>::~unique_lock(&local_180);
  pstore::transaction_base::allocate((transaction_base *)local_170,0x400000,1);
  pstore::transaction_base::commit((transaction_base *)local_170);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_170);
  r1_footer_offset.a_.a_ =
       (address)anon_unknown.dwarf_2883f3::Transaction::get_header(&this->super_Transaction);
  r1_footer = (trailer *)
              std::atomic::operator_cast_to_typed_address
                        ((atomic *)((long)r1_footer_offset.a_.a_ + 0x28));
  p_Var2 = &in_memory_store::buffer(&(this->super_Transaction).store_)->
            super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
  peVar3 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get(p_Var2);
  vVar4 = pstore::typed_address<pstore::trailer>::absolute
                    ((typed_address<pstore::trailer> *)&r1_footer);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((long)peVar3 + vVar4);
  local_1d8.expected_._M_elems =
       (StlContainer)
       testing::ContainerEq<std::array<unsigned_char,8ul>>
                 ((array<unsigned_char,_8UL> *)
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl);
  local_1d0._M_elems =
       (_Type)testing::internal::
              MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
                        ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,_8UL>_>_>
                          )local_1d8.expected_._M_elems);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
  ::operator()(local_1c8,(char *)&local_1d0,
               (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature1");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pMVar5 = testing::Message::operator<<
                       (&local_1e0,(char (*) [34])"Did not find r1 footer signature1");
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x10b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_1fc = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_std::atomic<unsigned_int>,_nullptr>
            ((EqHelper *)local_1f8,"1U","r1_footer->a.generation",&local_1fc,
             (atomic<unsigned_int> *)
             ((long)gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pMVar5 = testing::Message::operator<<
                       (&local_208,(char (*) [38])"r1 footer generation number must be 1");
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x10d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_224 = 0x400000;
  testing::internal::EqHelper::Compare<unsigned_int,_std::atomic<unsigned_long>,_nullptr>
            ((EqHelper *)local_220,"4194304U","r1_footer->a.size",&local_224,
             (atomic<unsigned_long> *)
             ((long)gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x10e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  local_258.expected_._M_elems =
       (StlContainer)
       testing::ContainerEq<std::array<unsigned_char,8ul>>
                 ((array<unsigned_char,_8UL> *)
                  ((long)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl + 0x68));
  local_250._M_elems =
       (_Type)testing::internal::
              MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
                        ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,_8UL>_>_>
                          )local_258.expected_._M_elems);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
  ::operator()(local_248,(char *)&local_250,
               (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature2");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pMVar5 = testing::Message::operator<<
                       (&local_260,(char (*) [34])"Did not find r1 footer signature2");
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&r0_footer_offset,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x110,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&r0_footer_offset,pMVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&r0_footer_offset);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  r0_footer = *(trailer **)
               ((long)gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x20);
  p_Var2 = &in_memory_store::buffer(&(this->super_Transaction).store_)->
            super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
  peVar3 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get(p_Var2);
  vVar4 = pstore::typed_address<pstore::trailer>::absolute
                    ((typed_address<pstore::trailer> *)&r0_footer);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((long)peVar3 + vVar4);
  local_298.expected_._M_elems =
       (StlContainer)
       testing::ContainerEq<std::array<unsigned_char,8ul>>
                 ((array<unsigned_char,_8UL> *)
                  gtest_ar_4.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl);
  local_290._M_elems =
       (_Type)testing::internal::
              MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
                        ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,_8UL>_>_>
                          )local_298.expected_._M_elems);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
  ::operator()(local_288,(char *)&local_290,
               (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature1");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pMVar5 = testing::Message::operator<<
                       (&local_2a0,(char (*) [34])"Did not find r0 footer signature1");
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x119,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,pMVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2bc = 0;
  testing::internal::EqHelper::Compare<unsigned_int,_std::atomic<unsigned_int>,_nullptr>
            ((EqHelper *)local_2b8,"0U","r0_footer->a.generation",&local_2bc,
             (atomic<unsigned_int> *)
             ((long)gtest_ar_4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    pMVar5 = testing::Message::operator<<
                       (&local_2c8,(char (*) [38])"r0 footer generation number must be 0");
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x11b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,pMVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  local_2e4 = 0;
  testing::internal::EqHelper::Compare<unsigned_int,_std::atomic<unsigned_long>,_nullptr>
            ((EqHelper *)local_2e0,"0U","r0_footer->a.size",&local_2e4,
             (atomic<unsigned_long> *)
             ((long)gtest_ar_4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pMVar5 = testing::Message::operator<<
                       (&local_2f0,(char (*) [42])"expected the r0 footer size value to be 0");
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x11c,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,pMVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  local_310 = pstore::typed_address<pstore::trailer>::null();
  testing::internal::EqHelper::
  Compare<pstore::typed_address<pstore::trailer>,_pstore::typed_address<pstore::trailer>,_nullptr>
            ((EqHelper *)local_308,"pstore::typed_address<pstore::trailer>::null ()",
             "r0_footer->a.prev_generation",&local_310,
             (typed_address<pstore::trailer> *)
             ((long)gtest_ar_4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x20));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pMVar5 = testing::Message::operator<<
                       (&local_318,
                        (char (*) [56])"The r0 footer should not point to a previous generation");
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x11d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,pMVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  local_340.expected_._M_elems =
       (StlContainer)
       testing::ContainerEq<std::array<unsigned_char,8ul>>
                 ((array<unsigned_char,_8UL> *)
                  ((long)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl + 0x68));
  local_338._M_elems =
       (_Type)testing::internal::
              MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
                        ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,_8UL>_>_>
                          )local_340.expected_._M_elems);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
  ::operator()(local_330,(char *)&local_338,
               (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature2");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pMVar5 = testing::Message::operator<<
                       (&local_348,(char (*) [34])"Did not find r0 footer signature2");
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x120,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,pMVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  testing::internal::CmpHelperGE<std::atomic<unsigned_long>,std::atomic<unsigned_long>>
            ((internal *)local_360,"r1_footer->a.time","r0_footer->a.time",
             (atomic<unsigned_long> *)
             ((long)gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x18),
             (atomic<unsigned_long> *)
             ((long)gtest_ar_4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x18));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pMVar5 = testing::Message::operator<<
                       (&local_368,(char (*) [41])"r1 time must not be earlier than r0 time");
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x123,pcVar6);
    testing::internal::AssertHelper::operator=(&local_370,pMVar5);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  pstore::database::~database((database *)local_130);
  return;
}

Assistant:

TEST_F (Transaction, CommitAfterAppending4Mb) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
    {
        mock_mutex mutex;
        auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});

        std::size_t const elements = (4U * 1024U * 1024U) / sizeof (int);
        transaction.allocate (elements * sizeof (int), 1 /*align*/);
        transaction.commit ();
    }

    // Check the two footers.
    {
        pstore::header const * const header = this->get_header ();
        pstore::typed_address<pstore::trailer> const r1_footer_offset = header->footer_pos;

        auto r1_footer = reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () +
                                                                    r1_footer_offset.absolute ());
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r1_footer->a.signature1))
            << "Did not find r1 footer signature1";
        EXPECT_EQ (1U, r1_footer->a.generation) << "r1 footer generation number must be 1";
        EXPECT_EQ (4194304U, r1_footer->a.size);
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r1_footer->signature2))
            << "Did not find r1 footer signature2";

        pstore::typed_address<pstore::trailer> const r0_footer_offset =
            r1_footer->a.prev_generation;

        auto r0_footer = reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () +
                                                                    r0_footer_offset.absolute ());
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r0_footer->a.signature1))
            << "Did not find r0 footer signature1";
        EXPECT_EQ (0U, r0_footer->a.generation) << "r0 footer generation number must be 0";
        EXPECT_EQ (0U, r0_footer->a.size) << "expected the r0 footer size value to be 0";
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::null (), r0_footer->a.prev_generation)
            << "The r0 footer should not point to a previous generation";
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r0_footer->signature2))
            << "Did not find r0 footer signature2";

        EXPECT_GE (r1_footer->a.time, r0_footer->a.time)
            << "r1 time must not be earlier than r0 time";
    }
}